

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O0

CreateExtkeyResponseStruct *
cfd::js::api::HDWalletStructApi::CreateExtkeyFromParentKey
          (CreateExtkeyResponseStruct *__return_storage_ptr__,
          CreateExtkeyFromParentKeyRequestStruct *request)

{
  CreateExtkeyFromParentKeyRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  CreateExtkeyFromParentKeyRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  CreateExtkeyFromParentKeyRequestStruct *request_local;
  CreateExtkeyResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  CreateExtkeyResponseStruct::CreateExtkeyResponseStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct(cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_const&)>
  ::
  function<cfd::js::api::HDWalletStructApi::CreateExtkeyFromParentKey(cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::CreateExtkeyResponseStruct(cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"CreateExtkeyFromParentKey",&local_129);
  ExecuteStructApi<cfd::js::api::CreateExtkeyFromParentKeyRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
            ((CreateExtkeyResponseStruct *)(local_108 + 0x20),(api *)this,
             (CreateExtkeyFromParentKeyRequestStruct *)local_108,&local_128,in_R8);
  CreateExtkeyResponseStruct::operator=
            (__return_storage_ptr__,(CreateExtkeyResponseStruct *)(local_108 + 0x20));
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct
            ((CreateExtkeyResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_&)>
  ::~function((function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

CreateExtkeyResponseStruct HDWalletStructApi::CreateExtkeyFromParentKey(
    const CreateExtkeyFromParentKeyRequestStruct& request) {
  auto call_func = [](const CreateExtkeyFromParentKeyRequestStruct& request)
      -> CreateExtkeyResponseStruct {
    CreateExtkeyResponseStruct response;
    const NetType net_type = AddressStructApi::ConvertNetType(request.network);
    ExtKeyType key_type = ConvertExtKeyType(request.extkey_type);
    uint32_t child_num = request.child_number;
    if (request.hardened) child_num |= 0x80000000U;

    if (key_type == ExtKeyType::kExtPrivkey) {
      Privkey privkey;
      if (request.parent_key.size() == (Privkey::kPrivkeySize * 2)) {
        privkey = Privkey(request.parent_key);
      } else {
        privkey = Privkey::FromWif(request.parent_key, net_type);
      }
      ExtPrivkey extprivkey(
          net_type, privkey, ByteData256(request.parent_chain_code),
          request.parent_depth, child_num);
      response.extkey = extprivkey.ToString();
    } else {
      ExtPubkey extpubkey(
          net_type, Pubkey(request.parent_key),
          ByteData256(request.parent_chain_code), request.parent_depth,
          child_num);
      response.extkey = extpubkey.ToString();
    }

    return response;
  };

  CreateExtkeyResponseStruct result;
  result = ExecuteStructApi<
      CreateExtkeyFromParentKeyRequestStruct, CreateExtkeyResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}